

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UBool __thiscall
icu_63::anon_unknown_16::PartLevelCallback::needToWrite(PartLevelCallback *this,Level l)

{
  int iVar1;
  int iVar2;
  SortKeyByteSink *pSVar3;
  
  pSVar3 = this->sink;
  iVar1 = pSVar3->capacity_;
  iVar2 = pSVar3->appended_;
  if (iVar1 < iVar2) {
    return '\0';
  }
  this->level = l;
  this->levelCapacity = (iVar1 - iVar2) + pSVar3->ignore_;
  return '\x01';
}

Assistant:

virtual UBool needToWrite(Collation::Level l) {
        if(!sink.Overflowed()) {
            // Remember a level that will be at least partially written.
            level = l;
            levelCapacity = sink.GetRemainingCapacity();
            return TRUE;
        } else {
            return FALSE;
        }
    }